

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O1

void Curl_llist_insert_next(Curl_llist *list,Curl_llist_element *e,void *p,Curl_llist_element *ne)

{
  size_t sVar1;
  Curl_llist_element **ppCVar2;
  Curl_llist *pCVar3;
  
  ne->ptr = p;
  sVar1 = list->size;
  if (sVar1 == 0) {
    list->head = ne;
    ppCVar2 = &list->tail;
    ne->prev = (Curl_llist_element *)0x0;
    ne->next = (Curl_llist_element *)0x0;
  }
  else {
    ppCVar2 = &e->next;
    pCVar3 = (Curl_llist *)ppCVar2;
    if (e == (Curl_llist_element *)0x0) {
      pCVar3 = list;
    }
    ne->next = pCVar3->head;
    ne->prev = e;
    if (e == (Curl_llist_element *)0x0) {
      list->head->prev = ne;
      pCVar3 = list;
    }
    else if (*ppCVar2 == (Curl_llist_element *)0x0) {
      pCVar3 = (Curl_llist *)&list->tail;
    }
    else {
      pCVar3 = (Curl_llist *)&(*ppCVar2)->prev;
    }
    pCVar3->head = ne;
    if (e == (Curl_llist_element *)0x0) goto LAB_005b4b57;
  }
  *ppCVar2 = ne;
LAB_005b4b57:
  list->size = sVar1 + 1;
  return;
}

Assistant:

void
Curl_llist_insert_next(struct Curl_llist *list, struct Curl_llist_element *e,
                       const void *p,
                       struct Curl_llist_element *ne)
{
  ne->ptr = (void *) p;
  if(list->size == 0) {
    list->head = ne;
    list->head->prev = NULL;
    list->head->next = NULL;
    list->tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->next = e?e->next:list->head;
    ne->prev = e;
    if(!e) {
      list->head->prev = ne;
      list->head = ne;
    }
    else if(e->next) {
      e->next->prev = ne;
    }
    else {
      list->tail = ne;
    }
    if(e)
      e->next = ne;
  }

  ++list->size;
}